

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::CenterView(BoardView *this)

{
  long in_RDI;
  float sy;
  float sx;
  float dy;
  float dx;
  ImVec2 view;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_10;
  undefined4 uStack_c;
  
  local_2c = (float)*(int *)(in_RDI + 0xd5e0) * 1.1;
  local_30 = (float)*(int *)(in_RDI + 0xd5e4) * 1.1;
  if (local_2c <= 0.0) {
    local_2c = 1.0;
  }
  else {
    local_10 = (float)*(undefined8 *)(in_RDI + 0xd5f0);
    local_2c = local_10 / local_2c;
  }
  if (local_30 <= 0.0) {
    local_30 = 1.0;
  }
  else {
    uStack_c = (float)((ulong)*(undefined8 *)(in_RDI + 0xd5f0) >> 0x20);
    local_30 = uStack_c / local_30;
  }
  if (local_30 <= local_2c) {
    local_34 = local_30;
  }
  else {
    local_34 = local_2c;
  }
  *(float *)(in_RDI + 0xd5c8) = local_34;
  *(float *)(in_RDI + 0xd5cc) = local_34;
  SetTarget((BoardView *)CONCAT44(local_2c,local_30),(float)((ulong)in_RDI >> 0x20),(float)in_RDI);
  *(undefined1 *)(in_RDI + 0xd6a6) = 1;
  return;
}

Assistant:

void BoardView::CenterView(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	float dx = 1.1f * (m_boardWidth);
	float dy = 1.1f * (m_boardHeight);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale_floor = m_scale = sx < sy ? sx : sy;
	SetTarget(m_mx, m_my);
	m_needsRedraw = true;
}